

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void api_suite::api_string_output(void)

{
  char input [8];
  string result;
  decoder_type decoder;
  value_type local_188 [12];
  undefined4 local_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_188 + 7;
  builtin_memcpy(local_188,"\"alpha\"",8);
  local_158.input.head = local_188;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_178._M_dataplus._M_p._0_4_ = local_158.current.code;
  local_17c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x79,"void api_suite::api_string_output()",&local_178,&local_17c);
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_158,&local_178);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x7c,"void api_suite::api_string_output()",&local_178,"alpha");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void api_string_output()
{
    const char input[] = "\"alpha\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    std::string result;
    TRIAL_PROTOCOL_TEST_NO_THROW(decoder.string_value<std::string>(result));
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
}